

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

aom_codec_err_t ctrl_set_active_map(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  undefined8 *puVar2;
  int iVar3;
  uint *in_RSI;
  long in_RDI;
  aom_active_map_t *map;
  long *local_38;
  aom_codec_err_t local_4;
  
  uVar1 = *in_RSI;
  if (uVar1 < 0x29) {
    local_38 = (long *)((long)(int)uVar1 + *(long *)(in_RSI + 4));
    *in_RSI = uVar1 + 8;
  }
  else {
    local_38 = *(long **)(in_RSI + 2);
    *(long **)(in_RSI + 2) = local_38 + 1;
  }
  puVar2 = (undefined8 *)*local_38;
  if (puVar2 == (undefined8 *)0x0) {
    local_4 = AOM_CODEC_INVALID_PARAM;
  }
  else {
    iVar3 = av1_set_active_map(*(AV1_COMP **)(*(long *)(in_RDI + 0xb50) + 0x160),(uchar *)*puVar2,
                               *(int *)(puVar2 + 1),*(int *)((long)puVar2 + 0xc));
    if (iVar3 == 0) {
      local_4 = AOM_CODEC_OK;
    }
    else {
      local_4 = AOM_CODEC_INVALID_PARAM;
    }
  }
  return local_4;
}

Assistant:

static aom_codec_err_t ctrl_set_active_map(aom_codec_alg_priv_t *ctx,
                                           va_list args) {
  aom_active_map_t *const map = va_arg(args, aom_active_map_t *);

  if (map) {
    if (!av1_set_active_map(ctx->ppi->cpi, map->active_map, (int)map->rows,
                            (int)map->cols))
      return AOM_CODEC_OK;
    else
      return AOM_CODEC_INVALID_PARAM;
  } else {
    return AOM_CODEC_INVALID_PARAM;
  }
}